

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm2d.c
# Opt level: O1

void av1_highbd_iwht4x4_16_add_c(tran_low_t *input,uint8_t *dest8,int stride,int bd)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  int aiStack_58 [6];
  tran_low_t output [16];
  
  lVar3 = (long)dest8 * 2;
  lVar4 = 0;
  do {
    iVar7 = (input[lVar4] >> 2) + (input[lVar4 + 4] >> 2);
    iVar9 = (input[lVar4 + 8] >> 2) - (input[lVar4 + 0xc] >> 2);
    iVar5 = iVar7 - iVar9 >> 1;
    iVar6 = iVar5 - (input[lVar4 + 0xc] >> 2);
    iVar5 = iVar5 - (input[lVar4 + 4] >> 2);
    aiStack_58[lVar4] = iVar7 - iVar6;
    aiStack_58[lVar4 + 4] = iVar6;
    output[lVar4 + 2] = iVar5;
    output[lVar4 + 6] = iVar9 + iVar5;
    lVar4 = lVar4 + 1;
  } while ((int)lVar4 != 4);
  lVar4 = lVar3 + (long)stride * 2;
  lVar1 = lVar3 + (long)(stride * 2) * 2;
  lVar2 = lVar3 + (long)(stride * 3) * 2;
  lVar8 = 0;
  do {
    iVar5 = aiStack_58[lVar8 * 2 + 1];
    iVar7 = aiStack_58[lVar8 * 2] + iVar5;
    iVar9 = aiStack_58[lVar8 * 2 + 2] - aiStack_58[lVar8 * 2 + 3];
    iVar10 = iVar7 - iVar9 >> 1;
    iVar6 = iVar10 - aiStack_58[lVar8 * 2 + 3];
    iVar7 = (uint)*(ushort *)(lVar3 + lVar8) + (iVar7 - iVar6);
    if (bd == 10) {
      if (0x3fe < iVar7) {
        iVar7 = 0x3ff;
      }
    }
    else if (bd == 0xc) {
      if (0xffe < iVar7) {
        iVar7 = 0xfff;
      }
    }
    else if (0xfe < iVar7) {
      iVar7 = 0xff;
    }
    if (iVar7 < 1) {
      iVar7 = 0;
    }
    *(short *)(lVar3 + lVar8) = (short)iVar7;
    iVar6 = iVar6 + (uint)*(ushort *)(lVar4 + lVar8);
    if (bd == 10) {
      if (0x3fe < iVar6) {
        iVar6 = 0x3ff;
      }
    }
    else if (bd == 0xc) {
      if (0xffe < iVar6) {
        iVar6 = 0xfff;
      }
    }
    else if (0xfe < iVar6) {
      iVar6 = 0xff;
    }
    if (iVar6 < 1) {
      iVar6 = 0;
    }
    iVar10 = iVar10 - iVar5;
    *(short *)(lVar4 + lVar8) = (short)iVar6;
    iVar5 = (uint)*(ushort *)(lVar1 + lVar8) + iVar10;
    if (bd == 10) {
      if (0x3fe < iVar5) {
        iVar5 = 0x3ff;
      }
    }
    else if (bd == 0xc) {
      if (0xffe < iVar5) {
        iVar5 = 0xfff;
      }
    }
    else if (0xfe < iVar5) {
      iVar5 = 0xff;
    }
    if (iVar5 < 1) {
      iVar5 = 0;
    }
    *(short *)(lVar1 + lVar8) = (short)iVar5;
    iVar5 = (uint)*(ushort *)(lVar2 + lVar8) + iVar10 + iVar9;
    if (bd == 10) {
      if (0x3fe < iVar5) {
        iVar5 = 0x3ff;
      }
    }
    else if (bd == 0xc) {
      if (0xffe < iVar5) {
        iVar5 = 0xfff;
      }
    }
    else if (0xfe < iVar5) {
      iVar5 = 0xff;
    }
    if (iVar5 < 1) {
      iVar5 = 0;
    }
    *(short *)(lVar2 + lVar8) = (short)iVar5;
    lVar8 = lVar8 + 2;
  } while ((int)lVar8 != 8);
  return;
}

Assistant:

void av1_highbd_iwht4x4_16_add_c(const tran_low_t *input, uint8_t *dest8,
                                 int stride, int bd) {
  /* 4-point reversible, orthonormal inverse Walsh-Hadamard in 3.5 adds,
     0.5 shifts per pixel. */
  int i;
  tran_low_t output[16];
  tran_low_t a1, b1, c1, d1, e1;
  const tran_low_t *ip = input;
  tran_low_t *op = output;
  uint16_t *dest = CONVERT_TO_SHORTPTR(dest8);

  for (i = 0; i < 4; i++) {
    a1 = ip[4 * 0] >> UNIT_QUANT_SHIFT;
    c1 = ip[4 * 1] >> UNIT_QUANT_SHIFT;
    d1 = ip[4 * 2] >> UNIT_QUANT_SHIFT;
    b1 = ip[4 * 3] >> UNIT_QUANT_SHIFT;
    a1 += c1;
    d1 -= b1;
    e1 = (a1 - d1) >> 1;
    b1 = e1 - b1;
    c1 = e1 - c1;
    a1 -= b1;
    d1 += c1;

    op[4 * 0] = a1;
    op[4 * 1] = b1;
    op[4 * 2] = c1;
    op[4 * 3] = d1;
    ip++;
    op++;
  }

  ip = output;
  for (i = 0; i < 4; i++) {
    a1 = ip[0];
    c1 = ip[1];
    d1 = ip[2];
    b1 = ip[3];
    a1 += c1;
    d1 -= b1;
    e1 = (a1 - d1) >> 1;
    b1 = e1 - b1;
    c1 = e1 - c1;
    a1 -= b1;
    d1 += c1;

    range_check_value(a1, bd + 1);
    range_check_value(b1, bd + 1);
    range_check_value(c1, bd + 1);
    range_check_value(d1, bd + 1);

    dest[stride * 0] = highbd_clip_pixel_add(dest[stride * 0], a1, bd);
    dest[stride * 1] = highbd_clip_pixel_add(dest[stride * 1], b1, bd);
    dest[stride * 2] = highbd_clip_pixel_add(dest[stride * 2], c1, bd);
    dest[stride * 3] = highbd_clip_pixel_add(dest[stride * 3], d1, bd);

    ip += 4;
    dest++;
  }
}